

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTD_row_update(ZSTD_matchState_t *ms,BYTE *ip)

{
  BYTE *pBVar1;
  BYTE *pBVar2;
  U32 *pUVar3;
  char cVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  
  uVar14 = (ms->cParams).searchLog;
  if (5 < uVar14) {
    uVar14 = 6;
  }
  bVar5 = 4;
  if (4 < uVar14) {
    bVar5 = (byte)uVar14;
  }
  uVar14 = (ms->cParams).minMatch;
  uVar13 = 6;
  if (uVar14 < 6) {
    uVar13 = uVar14;
  }
  uVar14 = ms->nextToUpdate;
  uVar15 = (ulong)uVar14;
  pBVar1 = (ms->window).base;
  uVar10 = (uint)((long)ip - (long)pBVar1);
  if (uVar10 < uVar14) {
    __assert_fail("target >= idx",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x770b,
                  "void ZSTD_row_update_internal(ZSTD_matchState_t *, const BYTE *, const U32, const U32, const U32, const U32)"
                 );
  }
  if (uVar14 < uVar10) {
    if (0x20 < ms->rowHashLog + 8) {
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    uVar14 = ~(-1 << (bVar5 & 0x1f));
    pBVar2 = ms->tagTable;
    pUVar3 = ms->hashTable;
    cVar4 = (char)ms->rowHashLog;
    bVar6 = 0x38 - cVar4;
    bVar7 = 0x18 - cVar4;
    do {
      if (uVar13 == 5) {
        uVar12 = *(long *)(pBVar1 + uVar15) * -0x30e4432345000000;
LAB_0018c2e5:
        uVar11 = (uint)((uVar12 ^ ms->hashSalt) >> (bVar6 & 0x3f));
      }
      else {
        if (uVar13 == 6) {
          uVar12 = *(long *)(pBVar1 + uVar15) * -0x30e4432340650000;
          goto LAB_0018c2e5;
        }
        uVar11 = (*(int *)(pBVar1 + uVar15) * -0x61c8864f ^ (uint)ms->hashSalt) >> (bVar7 & 0x1f);
      }
      lVar16 = (ulong)(uVar11 >> 8) << (bVar5 & 0x3f);
      uVar8 = pBVar2[lVar16] + 0x7f & uVar14;
      uVar12 = 0;
      if (uVar8 == 0) {
        uVar12 = (ulong)uVar14;
      }
      lVar9 = uVar8 + uVar12;
      pBVar2[lVar16] = (BYTE)lVar9;
      if (uVar13 == 5) {
        uVar12 = *(long *)(pBVar1 + uVar15) * -0x30e4432345000000;
LAB_0018c383:
        uVar12 = (uVar12 ^ ms->hashSalt) >> (bVar6 & 0x3f);
      }
      else {
        if (uVar13 == 6) {
          uVar12 = *(long *)(pBVar1 + uVar15) * -0x30e4432340650000;
          goto LAB_0018c383;
        }
        uVar12 = (ulong)((*(int *)(pBVar1 + uVar15) * -0x61c8864f ^ (uint)ms->hashSalt) >>
                        (bVar7 & 0x1f));
      }
      if (uVar12 != uVar11) {
        __assert_fail("hash == ZSTD_hashPtrSalted(base + updateStartIdx, hashLog + ZSTD_ROW_HASH_TAG_BITS, mls, ms->hashSalt)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76e9,
                      "void ZSTD_row_update_internalImpl(ZSTD_matchState_t *, U32, const U32, const U32, const U32, const U32, const U32)"
                     );
      }
      pBVar2[lVar9 + lVar16] = (BYTE)uVar11;
      pUVar3[lVar16 + lVar9] = (U32)uVar15;
      uVar15 = uVar15 + 1;
    } while (uVar15 < ((long)ip - (long)pBVar1 & 0xffffffffU));
  }
  ms->nextToUpdate = uVar10;
  return;
}

Assistant:

void ZSTD_row_update(ZSTD_matchState_t* const ms, const BYTE* ip) {
    const U32 rowLog = BOUNDED(4, ms->cParams.searchLog, 6);
    const U32 rowMask = (1u << rowLog) - 1;
    const U32 mls = MIN(ms->cParams.minMatch, 6 /* mls caps out at 6 */);

    DEBUGLOG(5, "ZSTD_row_update(), rowLog=%u", rowLog);
    ZSTD_row_update_internal(ms, ip, mls, rowLog, rowMask, 0 /* don't use cache */);
}